

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int thread_peak_read_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  int iVar2;
  size_t __n;
  uint64_t result;
  
  if (newp == (void *)0x0 && newlen == 0) {
    duckdb_je_peak_event_update(tsd);
    result = duckdb_je_peak_event_max(tsd);
    iVar2 = 0;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar1 = *oldlenp;
      if (uVar1 == 8) {
        *(uint64_t *)oldp = result;
      }
      else {
        __n = 8;
        if (uVar1 < 8) {
          __n = uVar1;
        }
        switchD_01939fa4::default(oldp,&result,__n);
        *oldlenp = __n;
        iVar2 = 0x16;
      }
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
thread_peak_read_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	if (!config_stats) {
		return ENOENT;
	}
	READONLY();
	peak_event_update(tsd);
	uint64_t result = peak_event_max(tsd);
	READ(result, uint64_t);
	ret = 0;
label_return:
	return ret;
}